

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainFrame.c
# Opt level: O1

void Abc_FrameDeallocate(Abc_Frame_t *p)

{
  Vec_Int_t *pVVar1;
  void *pvVar2;
  int *piVar3;
  void **__ptr;
  Vec_Wec_t *__ptr_00;
  Abc_Frame_t *pAVar4;
  long lVar5;
  Ndr_Data_t *p_1;
  Vec_Ptr_t *pVVar6;
  long lVar7;
  
  Rwt_ManGlobalStop();
  pVVar1 = p->vAbcObjIds;
  if (pVVar1 != (Vec_Int_t *)0x0) {
    if (pVVar1->pArray != (int *)0x0) {
      free(pVVar1->pArray);
      pVVar1->pArray = (int *)0x0;
    }
    free(pVVar1);
  }
  pVVar6 = p->vCexVec;
  if (pVVar6 != (Vec_Ptr_t *)0x0) {
    if (0 < pVVar6->nSize) {
      lVar7 = 0;
      do {
        if ((void *)0x2 < pVVar6->pArray[lVar7]) {
          free(pVVar6->pArray[lVar7]);
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < pVVar6->nSize);
    }
    if (pVVar6->pArray != (void **)0x0) {
      free(pVVar6->pArray);
      pVVar6->pArray = (void **)0x0;
    }
    free(pVVar6);
  }
  pVVar6 = p->vPoEquivs;
  if (pVVar6 != (Vec_Ptr_t *)0x0) {
    if (0 < pVVar6->nSize) {
      lVar7 = 0;
      do {
        pvVar2 = pVVar6->pArray[lVar7];
        if (pvVar2 != (void *)0x0) {
          if (*(void **)((long)pvVar2 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar2 + 8));
            *(undefined8 *)((long)pvVar2 + 8) = 0;
          }
          free(pvVar2);
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < pVVar6->nSize);
    }
    if (pVVar6->pArray != (void **)0x0) {
      free(pVVar6->pArray);
      pVVar6->pArray = (void **)0x0;
    }
    free(pVVar6);
  }
  pVVar1 = p->vStatuses;
  if (pVVar1 != (Vec_Int_t *)0x0) {
    if (pVVar1->pArray != (int *)0x0) {
      free(pVVar1->pArray);
      pVVar1->pArray = (int *)0x0;
    }
    free(pVVar1);
  }
  if ((Dec_Man_t *)p->pManDec != (Dec_Man_t *)0x0) {
    Dec_ManStop((Dec_Man_t *)p->pManDec);
  }
  if (p->dd != (DdManager *)0x0) {
    Extra_StopManager(p->dd);
  }
  pVVar6 = p->vStore;
  if (pVVar6 != (Vec_Ptr_t *)0x0) {
    if (pVVar6->pArray != (void **)0x0) {
      free(pVVar6->pArray);
      pVVar6->pArray = (void **)0x0;
    }
    free(pVVar6);
  }
  if ((Aig_Man_t *)p->pSave1 != (Aig_Man_t *)0x0) {
    Aig_ManStop((Aig_Man_t *)p->pSave1);
  }
  if ((Aig_Man_t *)p->pSave2 != (Aig_Man_t *)0x0) {
    Aig_ManStop((Aig_Man_t *)p->pSave2);
  }
  if ((Aig_Man_t *)p->pSave3 != (Aig_Man_t *)0x0) {
    Aig_ManStop((Aig_Man_t *)p->pSave3);
  }
  if ((Aig_Man_t *)p->pSave4 != (Aig_Man_t *)0x0) {
    Aig_ManStop((Aig_Man_t *)p->pSave4);
  }
  if ((If_DsdMan_t *)p->pManDsd != (If_DsdMan_t *)0x0) {
    If_DsdManFree((If_DsdMan_t *)p->pManDsd,0);
  }
  if ((If_DsdMan_t *)p->pManDsd2 != (If_DsdMan_t *)0x0) {
    If_DsdManFree((If_DsdMan_t *)p->pManDsd2,0);
  }
  if (p->pNtkBackup != (Abc_Ntk_t *)0x0) {
    Abc_NtkDelete(p->pNtkBackup);
  }
  if (p->vPlugInComBinPairs != (Vec_Ptr_t *)0x0) {
    pVVar6 = p->vPlugInComBinPairs;
    if (0 < pVVar6->nSize) {
      lVar7 = 0;
      do {
        if (pVVar6->pArray[lVar7] != (void *)0x0) {
          free(pVVar6->pArray[lVar7]);
        }
        lVar7 = lVar7 + 1;
        pVVar6 = p->vPlugInComBinPairs;
      } while (lVar7 < pVVar6->nSize);
    }
    if (pVVar6->pArray != (void **)0x0) {
      free(pVVar6->pArray);
      pVVar6->pArray = (void **)0x0;
    }
    if (pVVar6 != (Vec_Ptr_t *)0x0) {
      free(pVVar6);
    }
  }
  if (p->vIndFlops != (Vec_Int_t *)0x0) {
    piVar3 = p->vIndFlops->pArray;
    if (piVar3 != (int *)0x0) {
      free(piVar3);
      p->vIndFlops->pArray = (int *)0x0;
    }
    if (p->vIndFlops != (Vec_Int_t *)0x0) {
      free(p->vIndFlops);
      p->vIndFlops = (Vec_Int_t *)0x0;
    }
  }
  if (p->vLTLProperties_global != (Vec_Ptr_t *)0x0) {
    __ptr = p->vLTLProperties_global->pArray;
    if (__ptr != (void **)0x0) {
      free(__ptr);
      p->vLTLProperties_global->pArray = (void **)0x0;
    }
    if (p->vLTLProperties_global != (Vec_Ptr_t *)0x0) {
      free(p->vLTLProperties_global);
      p->vLTLProperties_global = (Vec_Ptr_t *)0x0;
    }
  }
  pVVar6 = p->vSignalNames;
  if (pVVar6 != (Vec_Ptr_t *)0x0) {
    if (0 < pVVar6->nSize) {
      lVar7 = 0;
      do {
        if ((void *)0x2 < pVVar6->pArray[lVar7]) {
          free(pVVar6->pArray[lVar7]);
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < pVVar6->nSize);
    }
    if (pVVar6->pArray != (void **)0x0) {
      free(pVVar6->pArray);
      pVVar6->pArray = (void **)0x0;
    }
    free(pVVar6);
  }
  Abc_FrameDeleteAllNetworks(p);
  if (p->pDrivingCell != (char *)0x0) {
    free(p->pDrivingCell);
    p->pDrivingCell = (char *)0x0;
  }
  if (p->pCex2 != (Abc_Cex_t *)0x0) {
    free(p->pCex2);
    p->pCex2 = (Abc_Cex_t *)0x0;
  }
  if (p->pCex != (Abc_Cex_t *)0x0) {
    free(p->pCex);
    p->pCex = (Abc_Cex_t *)0x0;
  }
  if (p->pAbcWlcInv != (Vec_Int_t *)0x0) {
    piVar3 = p->pAbcWlcInv->pArray;
    if (piVar3 != (int *)0x0) {
      free(piVar3);
      p->pAbcWlcInv->pArray = (int *)0x0;
    }
    if (p->pAbcWlcInv != (Vec_Int_t *)0x0) {
      free(p->pAbcWlcInv);
      p->pAbcWlcInv = (Vec_Int_t *)0x0;
    }
  }
  Abc_NamDeref(s_GlobalFrame->pJsonStrs);
  pAVar4 = s_GlobalFrame;
  __ptr_00 = s_GlobalFrame->vJsonObjs;
  if (__ptr_00 != (Vec_Wec_t *)0x0) {
    if (0 < __ptr_00->nCap) {
      lVar7 = 8;
      lVar5 = 0;
      do {
        pvVar2 = *(void **)((long)&__ptr_00->pArray->nCap + lVar7);
        if (pvVar2 != (void *)0x0) {
          free(pvVar2);
          *(undefined8 *)((long)&__ptr_00->pArray->nCap + lVar7) = 0;
        }
        lVar5 = lVar5 + 1;
        lVar7 = lVar7 + 0x10;
      } while (lVar5 < __ptr_00->nCap);
    }
    if (__ptr_00->pArray != (Vec_Int_t *)0x0) {
      free(__ptr_00->pArray);
      __ptr_00->pArray = (Vec_Int_t *)0x0;
    }
    __ptr_00->nCap = 0;
    __ptr_00->nSize = 0;
    free(__ptr_00);
    pAVar4->vJsonObjs = (Vec_Wec_t *)0x0;
  }
  pvVar2 = pAVar4->pNdr;
  if (pvVar2 != (void *)0x0) {
    free(*(void **)((long)pvVar2 + 8));
    free(*(void **)((long)pvVar2 + 0x10));
    free(pvVar2);
  }
  if (pAVar4->pNdrArray != (int *)0x0) {
    free(pAVar4->pNdrArray);
    pAVar4->pNdrArray = (int *)0x0;
  }
  Gia_ManStopP(&p->pGiaMiniAig);
  Gia_ManStopP(&p->pGiaMiniLut);
  if (p->vCopyMiniAig != (Vec_Int_t *)0x0) {
    piVar3 = p->vCopyMiniAig->pArray;
    if (piVar3 != (int *)0x0) {
      free(piVar3);
      p->vCopyMiniAig->pArray = (int *)0x0;
    }
    if (p->vCopyMiniAig != (Vec_Int_t *)0x0) {
      free(p->vCopyMiniAig);
      p->vCopyMiniAig = (Vec_Int_t *)0x0;
    }
  }
  if (p->vCopyMiniLut != (Vec_Int_t *)0x0) {
    piVar3 = p->vCopyMiniLut->pArray;
    if (piVar3 != (int *)0x0) {
      free(piVar3);
      p->vCopyMiniLut->pArray = (int *)0x0;
    }
    if (p->vCopyMiniLut != (Vec_Int_t *)0x0) {
      free(p->vCopyMiniLut);
      p->vCopyMiniLut = (Vec_Int_t *)0x0;
    }
  }
  if (p->pArray != (int *)0x0) {
    free(p->pArray);
    p->pArray = (int *)0x0;
  }
  if (p->pBoxes != (int *)0x0) {
    free(p->pBoxes);
    p->pBoxes = (int *)0x0;
  }
  if (p != (Abc_Frame_t *)0x0) {
    free(p);
  }
  s_GlobalFrame = (Abc_Frame_t *)0x0;
  return;
}

Assistant:

void Abc_FrameDeallocate( Abc_Frame_t * p )
{
    extern void Rwt_ManGlobalStop();
    extern void undefine_cube_size();
//    extern void Ivy_TruthManStop();
//    Abc_HManStop();
//    undefine_cube_size();
    Rwt_ManGlobalStop();
//    Ivy_TruthManStop();
    if ( p->vAbcObjIds)  Vec_IntFree( p->vAbcObjIds );
    if ( p->vCexVec   )  Vec_PtrFreeFree( p->vCexVec );
    if ( p->vPoEquivs )  Vec_VecFree( (Vec_Vec_t *)p->vPoEquivs );
    if ( p->vStatuses )  Vec_IntFree( p->vStatuses );
    if ( p->pManDec   )  Dec_ManStop( (Dec_Man_t *)p->pManDec );
#ifdef ABC_USE_CUDD
    if ( p->dd        )  Extra_StopManager( p->dd );
#endif
    if ( p->vStore    )  Vec_PtrFree( p->vStore );
    if ( p->pSave1    )  Aig_ManStop( (Aig_Man_t *)p->pSave1 );
    if ( p->pSave2    )  Aig_ManStop( (Aig_Man_t *)p->pSave2 );
    if ( p->pSave3    )  Aig_ManStop( (Aig_Man_t *)p->pSave3 );
    if ( p->pSave4    )  Aig_ManStop( (Aig_Man_t *)p->pSave4 );
    if ( p->pManDsd   )  If_DsdManFree( (If_DsdMan_t *)p->pManDsd, 0 );
    if ( p->pManDsd2  )  If_DsdManFree( (If_DsdMan_t *)p->pManDsd2, 0 );
    if ( p->pNtkBackup)  Abc_NtkDelete( p->pNtkBackup );
    if ( p->vPlugInComBinPairs ) 
    {
        char * pTemp;
        int i;
        Vec_PtrForEachEntry( char *, p->vPlugInComBinPairs, pTemp, i )
            ABC_FREE( pTemp );
        Vec_PtrFree( p->vPlugInComBinPairs );
    }
    Vec_IntFreeP( &p->vIndFlops );
    Vec_PtrFreeP( &p->vLTLProperties_global );
    if ( p->vSignalNames )
    Vec_PtrFreeFree( p->vSignalNames );
    Abc_FrameDeleteAllNetworks( p );
    ABC_FREE( p->pDrivingCell );
    ABC_FREE( p->pCex2 );
    ABC_FREE( p->pCex );
    Vec_IntFreeP( &p->pAbcWlcInv );
    Abc_NamDeref( s_GlobalFrame->pJsonStrs );
    Vec_WecFreeP( &s_GlobalFrame->vJsonObjs );  
    Ndr_Delete( s_GlobalFrame->pNdr );
    ABC_FREE( s_GlobalFrame->pNdrArray );

    Gia_ManStopP( &p->pGiaMiniAig );
    Gia_ManStopP( &p->pGiaMiniLut );
    Vec_IntFreeP( &p->vCopyMiniAig );
    Vec_IntFreeP( &p->vCopyMiniLut );
    ABC_FREE( p->pArray );
    ABC_FREE( p->pBoxes );
    

    ABC_FREE( p );
    s_GlobalFrame = NULL;
}